

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPErrMemory(xmlSchemaParserCtxtPtr ctxt)

{
  void *local_28;
  void *data;
  xmlStructuredErrorFunc schannel;
  xmlGenericErrorFunc channel;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  schannel = (xmlStructuredErrorFunc)0x0;
  data = (void *)0x0;
  local_28 = (void *)0x0;
  if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
    ctxt->nberrors = ctxt->nberrors + 1;
    ctxt->err = 2;
    schannel = (xmlStructuredErrorFunc)ctxt->error;
    data = ctxt->serror;
    local_28 = ctxt->errCtxt;
  }
  xmlRaiseMemoryError((xmlStructuredErrorFunc)data,(xmlGenericErrorFunc)schannel,local_28,0x10,
                      (xmlError *)0x0);
  return;
}

Assistant:

static void
xmlSchemaPErrMemory(xmlSchemaParserCtxtPtr ctxt)
{
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        ctxt->nberrors++;
        ctxt->err = XML_ERR_NO_MEMORY;
        channel = ctxt->error;
        schannel = ctxt->serror;
        data = ctxt->errCtxt;
    }

    xmlRaiseMemoryError(schannel, channel, data, XML_FROM_SCHEMASP, NULL);
}